

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  void *pvVar1;
  xmlNsPtr pxVar2;
  xmlNodePtr pxVar3;
  long lVar4;
  _xmlNode *p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  _xmlAttr *p_Var9;
  void *local_50;
  
  iVar6 = -1;
  if ((((tree != (xmlNodePtr)0x0) && (doc != (xmlDocPtr)0x0)) && (tree->type == XML_ELEMENT_NODE))
     && ((doc->type == XML_DOCUMENT_NODE && (tree->doc == doc)))) {
    uVar7 = 0;
    iVar6 = 0;
    pvVar1 = (void *)0x0;
    local_50 = (void *)0x0;
    pxVar3 = tree;
    do {
      if (pxVar3->ns != (xmlNs *)0x0) {
        if (iVar6 == 0) {
          local_50 = (*xmlMalloc)(0x50);
          if (local_50 == (void *)0x0) {
LAB_001868a7:
            __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
            return -1;
          }
          pvVar1 = (*xmlMalloc)(0x50);
          if (pvVar1 != (void *)0x0) {
            iVar6 = 10;
            goto LAB_00186595;
          }
LAB_00186881:
          __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
LAB_001868e9:
          (*xmlFree)(local_50);
          return -1;
        }
LAB_00186595:
        if ((int)uVar7 < 1) {
          uVar8 = 0;
LAB_001865c1:
          if ((uint)uVar8 != uVar7) goto LAB_00186685;
        }
        else {
          uVar8 = 0;
          do {
            if (*(xmlNs **)((long)local_50 + uVar8 * 8) == pxVar3->ns) {
              pxVar3->ns = *(xmlNs **)((long)pvVar1 + uVar8 * 8);
              goto LAB_001865c1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        pxVar2 = xmlNewReconciledNs(doc,tree,pxVar3->ns);
        if (pxVar2 != (xmlNsPtr)0x0) {
          if (iVar6 <= (int)uVar7) {
            iVar6 = iVar6 * 2;
            local_50 = (*xmlRealloc)(local_50,(long)iVar6 << 3);
            if (local_50 == (void *)0x0) {
LAB_001868c3:
              local_50 = pvVar1;
              __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"fixing namespaces");
              goto LAB_001868e9;
            }
            pvVar1 = (*xmlRealloc)(pvVar1,(long)iVar6 << 3);
            if (pvVar1 == (void *)0x0) goto LAB_00186881;
          }
          lVar4 = (long)(int)uVar7;
          *(xmlNsPtr *)((long)pvVar1 + lVar4 * 8) = pxVar2;
          uVar7 = uVar7 + 1;
          *(xmlNs **)((long)local_50 + lVar4 * 8) = pxVar3->ns;
          pxVar3->ns = pxVar2;
        }
      }
LAB_00186685:
      if (pxVar3->type == XML_ELEMENT_NODE) {
        for (p_Var9 = pxVar3->properties; p_Var9 != (_xmlAttr *)0x0; p_Var9 = p_Var9->next) {
          if (p_Var9->ns != (xmlNs *)0x0) {
            if (iVar6 == 0) {
              local_50 = (*xmlMalloc)(0x50);
              if (local_50 == (void *)0x0) goto LAB_001868a7;
              pvVar1 = (*xmlMalloc)(0x50);
              if (pvVar1 == (void *)0x0) goto LAB_00186881;
              iVar6 = 10;
            }
            if ((int)uVar7 < 1) {
              uVar8 = 0;
LAB_00186723:
              if ((uint)uVar8 != uVar7) goto LAB_001867e8;
            }
            else {
              uVar8 = 0;
              do {
                if (*(xmlNs **)((long)local_50 + uVar8 * 8) == p_Var9->ns) {
                  p_Var9->ns = *(xmlNs **)((long)pvVar1 + uVar8 * 8);
                  goto LAB_00186723;
                }
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
            pxVar2 = xmlNewReconciledNs(doc,tree,p_Var9->ns);
            if (pxVar2 != (xmlNsPtr)0x0) {
              if (iVar6 <= (int)uVar7) {
                iVar6 = iVar6 * 2;
                local_50 = (*xmlRealloc)(local_50,(long)iVar6 << 3);
                if (local_50 == (void *)0x0) goto LAB_001868c3;
                pvVar1 = (*xmlRealloc)(pvVar1,(long)iVar6 << 3);
                if (pvVar1 == (void *)0x0) goto LAB_00186881;
              }
              lVar4 = (long)(int)uVar7;
              *(xmlNsPtr *)((long)pvVar1 + lVar4 * 8) = pxVar2;
              uVar7 = uVar7 + 1;
              *(xmlNs **)((long)local_50 + lVar4 * 8) = p_Var9->ns;
              p_Var9->ns = pxVar2;
            }
          }
LAB_001867e8:
        }
      }
      p_Var5 = pxVar3->children;
      if ((p_Var5 == (_xmlNode *)0x0) || (pxVar3->type == XML_ENTITY_REF_NODE)) {
        if (pxVar3 == tree) break;
        p_Var5 = pxVar3->next;
        if (p_Var5 == (_xmlNode *)0x0) {
          do {
            p_Var5 = pxVar3;
            if (pxVar3 == tree) goto LAB_00186847;
            if (pxVar3->parent != (xmlNodePtr)0x0) {
              pxVar3 = pxVar3->parent;
            }
            if ((pxVar3 != tree) && (p_Var5 = pxVar3->next, pxVar3->next != (_xmlNode *)0x0))
            goto LAB_00186847;
          } while (pxVar3->parent != (_xmlNode *)0x0);
          p_Var5 = (_xmlNode *)0x0;
LAB_00186847:
          if (p_Var5 == tree) break;
        }
      }
      pxVar3 = p_Var5;
    } while (p_Var5 != (_xmlNode *)0x0);
    if (local_50 != (void *)0x0) {
      (*xmlFree)(local_50);
    }
    iVar6 = 0;
    if (pvVar1 != (void *)0x0) {
      (*xmlFree)(pvVar1);
    }
  }
  return iVar6;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsPtr *oldNs = NULL;
    xmlNsPtr *newNs = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if ((doc == NULL) || (doc->type != XML_DOCUMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    /*
	     * initialize the cache if needed
	     */
	    if (sizeCache == 0) {
		sizeCache = 10;
		oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (oldNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    return(-1);
		}
		newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (newNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    xmlFree(oldNs);
		    return(-1);
		}
	    }
	    for (i = 0;i < nbCache;i++) {
	        if (oldNs[i] == node->ns) {
		    node->ns = newNs[i];
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(doc, tree, node->ns);
		if (n != NULL) { /* :-( what if else ??? */
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if (sizeCache <= nbCache) {
		        sizeCache *= 2;
			oldNs = (xmlNsPtr *) xmlRealloc(oldNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(newNs);
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlRealloc(newNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    newNs[nbCache] = n;
		    oldNs[nbCache++] = node->ns;
		    node->ns = n;
                }
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    /*
		     * initialize the cache if needed
		     */
		    if (sizeCache == 0) {
			sizeCache = 10;
			oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    for (i = 0;i < nbCache;i++) {
			if (oldNs[i] == attr->ns) {
			    attr->ns = newNs[i];
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(doc, tree, attr->ns);
			if (n != NULL) { /* :-( what if else ??? */
			    /*
			     * check if we need to grow the cache buffers.
			     */
			    if (sizeCache <= nbCache) {
				sizeCache *= 2;
				oldNs = (xmlNsPtr *) xmlRealloc(oldNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (oldNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(newNs);
				    return(-1);
				}
				newNs = (xmlNsPtr *) xmlRealloc(newNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (newNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(oldNs);
				    return(-1);
				}
			    }
			    newNs[nbCache] = n;
			    oldNs[nbCache++] = attr->ns;
			    attr->ns = n;
			}
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (oldNs != NULL)
	xmlFree(oldNs);
    if (newNs != NULL)
	xmlFree(newNs);
    return(ret);
}